

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

int anon_unknown.dwarf_23886::Choose(int n)

{
  uint __seed;
  uint in_ECX;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __pid_t local_40;
  int local_3c;
  int ret;
  int i;
  int n_local;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  long *local_10;
  
  ret = n;
  if (n < 1) {
    die("n > 0 failed at line __LINE__");
    llvm::llvm_unreachable_internal
              ((llvm *)"assert",
               "/workspace/llm4binary/github/license_c_cmakelists/regehr[P]opt-fuzz/opt-fuzz.cpp",
               (char *)0xf7,in_ECX);
  }
  local_3c = 0;
  while( true ) {
    if (ret + -1 <= local_3c) {
      std::__cxx11::to_string(&local_d0,ret + -1);
      std::operator+(&local_b0,&local_d0," ");
      std::__cxx11::string::operator+=
                ((string *)(anonymous_namespace)::Choices_abi_cxx11_,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      return ret + -1;
    }
    if ((*(byte *)((anonymous_namespace)::Shmem + 0x292) & 1) != 0) break;
    local_40 = fork();
    if (local_40 == -1) {
      die("fork failed");
    }
    if (local_40 == 0) {
      local_10 = (anonymous_namespace)::Shmem;
      local_18 = 1;
      local_1c = 5;
      local_28 = 1;
      LOCK();
      (anonymous_namespace)::Id = *(anonymous_namespace)::Shmem;
      *(anonymous_namespace)::Shmem = *(anonymous_namespace)::Shmem + 1;
      UNLOCK();
      _n_local = (anonymous_namespace)::Id;
      std::__cxx11::to_string(&local_80,local_3c);
      std::operator+(&local_60,&local_80," ");
      std::__cxx11::string::operator+=
                ((string *)(anonymous_namespace)::Choices_abi_cxx11_,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      (anonymous_namespace)::Depth = (anonymous_namespace)::Depth + 1;
      __seed = getpid();
      srand(__seed);
      return local_3c;
    }
    increase_runners((anonymous_namespace)::Depth);
    waitpid(-1,(int *)0x0,1);
    local_3c = local_3c + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1));
  exit(-1);
}

Assistant:

int Choose(int n) {
  assert(n > 0);
  for (int i = 0; i < (n - 1); ++i) {
    if (Shmem->Stop) {
      pthread_mutex_unlock(&Shmem->Lock);
      exit(-1);
    }
    int ret = ::fork();
    if (ret == -1)
      die("fork failed");
    if (ret == 0) {
      // child
      Id = Shmem->NextId.fetch_add(1);
      Choices += std::to_string(i) + " ";
      ++Depth;
      ::srand(::getpid());
      return i;
    }
    // parent
    increase_runners(Depth);
    waitpid(-1, 0, WNOHANG);
  }
  Choices += std::to_string(n - 1) + " ";
  return n - 1;
}